

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O0

bool ot::commissioner::coap::Message::IsCriticalOption(OptionType aNumber)

{
  bool local_9;
  OptionType aNumber_local;
  
  if ((((((aNumber == kIfMatch) || (aNumber == kUriHost)) || (aNumber == kIfNonMatch)) ||
       ((aNumber == kUriPort || (aNumber == kUriPath)))) ||
      ((aNumber == kUriQuery || ((aNumber == kAccept || (aNumber == kProxyUri)))))) ||
     (aNumber == kProxyScheme)) {
    local_9 = true;
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool Message::IsCriticalOption(OptionType aNumber)
{
    switch (aNumber)
    {
    case OptionType::kIfMatch:
    case OptionType::kUriHost:
    case OptionType::kIfNonMatch:
    case OptionType::kUriPort:
    case OptionType::kUriPath:
    case OptionType::kUriQuery:
    case OptionType::kAccept:
    case OptionType::kProxyUri:
    case OptionType::kProxyScheme:
        return true;
    default:
        return false;
    }
}